

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ProgressCheck(Parse *p)

{
  sqlite3 *psVar1;
  _func_int_void_ptr *p_Var2;
  int iVar3;
  uint uVar4;
  
  psVar1 = p->db;
  if ((psVar1->u1).isInterrupted != 0) {
    p->nErr = p->nErr + 1;
    p->rc = 9;
  }
  p_Var2 = psVar1->xProgress;
  if (p_Var2 != (_func_int_void_ptr *)0x0) {
    if (p->rc != 9) {
      uVar4 = p->nProgressSteps + 1;
      p->nProgressSteps = uVar4;
      if (uVar4 < psVar1->nProgressOps) {
        return;
      }
      iVar3 = (*p_Var2)(psVar1->pProgressArg);
      if (iVar3 != 0) {
        p->nErr = p->nErr + 1;
        p->rc = 9;
      }
    }
    p->nProgressSteps = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ProgressCheck(Parse *p){
  sqlite3 *db = p->db;
  if( AtomicLoad(&db->u1.isInterrupted) ){
    p->nErr++;
    p->rc = SQLITE_INTERRUPT;
  }
#ifndef SQLITE_OMIT_PROGRESS_CALLBACK
  if( db->xProgress ){
    if( p->rc==SQLITE_INTERRUPT ){
      p->nProgressSteps = 0;
    }else if( (++p->nProgressSteps)>=db->nProgressOps ){
      if( db->xProgress(db->pProgressArg) ){
        p->nErr++;
        p->rc = SQLITE_INTERRUPT;
      }
      p->nProgressSteps = 0;
    }
  }
#endif
}